

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_accept(uv_stream_t *server,uv_stream_t *client)

{
  byte *pbVar1;
  uv_handle_type uVar2;
  void *ptr;
  int iVar3;
  uint uVar4;
  
  if (server->loop != client->loop) {
    __assert_fail("server->loop == client->loop",
                  "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                  ,0x252,"int uv_accept(uv_stream_t *, uv_stream_t *)");
  }
  iVar3 = server->accepted_fd;
  if (iVar3 == -1) {
    return -0xb;
  }
  uVar2 = client->type;
  if (uVar2 != UV_NAMED_PIPE) {
    if (uVar2 == UV_UDP) {
      iVar3 = uv_udp_open((uv_udp_t *)client,iVar3);
      goto LAB_0011141f;
    }
    if (uVar2 != UV_TCP) {
      return -0x16;
    }
  }
  iVar3 = uv__stream_open(client,iVar3,0xc000);
LAB_0011141f:
  if (iVar3 == 0) {
    pbVar1 = (byte *)((long)&client->flags + 1);
    *pbVar1 = *pbVar1 | 0x20;
    iVar3 = 0;
  }
  else {
    uv__close(server->accepted_fd);
  }
  ptr = server->queued_fds;
  if (ptr == (void *)0x0) {
    server->accepted_fd = -1;
    if (iVar3 == 0) {
      uv__io_start(server->loop,&server->io_watcher,1);
    }
  }
  else {
    server->accepted_fd = *(int *)((long)ptr + 8);
    if (*(int *)((long)ptr + 4) == 0) {
      __assert_fail("queued_fds->offset > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/xhawk18[P]s_task/libuv/src/unix/stream.c"
                    ,0x27d,"int uv_accept(uv_stream_t *, uv_stream_t *)");
    }
    uVar4 = *(int *)((long)ptr + 4) - 1;
    *(uint *)((long)ptr + 4) = uVar4;
    if (uVar4 == 0) {
      uv__free(ptr);
      server->queued_fds = (void *)0x0;
    }
    else {
      memmove((void *)((long)ptr + 8),(void *)((long)ptr + 0xc),(ulong)uVar4 << 2);
    }
  }
  return iVar3;
}

Assistant:

int uv_accept(uv_stream_t* server, uv_stream_t* client) {
  int err;

  assert(server->loop == client->loop);

  if (server->accepted_fd == -1)
    return UV_EAGAIN;

  switch (client->type) {
    case UV_NAMED_PIPE:
    case UV_TCP:
      err = uv__stream_open(client,
                            server->accepted_fd,
                            UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
      if (err) {
        /* TODO handle error */
        uv__close(server->accepted_fd);
        goto done;
      }
      break;

    case UV_UDP:
      err = uv_udp_open((uv_udp_t*) client, server->accepted_fd);
      if (err) {
        uv__close(server->accepted_fd);
        goto done;
      }
      break;

    default:
      return UV_EINVAL;
  }

  client->flags |= UV_HANDLE_BOUND;

done:
  /* Process queued fds */
  if (server->queued_fds != NULL) {
    uv__stream_queued_fds_t* queued_fds;

    queued_fds = server->queued_fds;

    /* Read first */
    server->accepted_fd = queued_fds->fds[0];

    /* All read, free */
    assert(queued_fds->offset > 0);
    if (--queued_fds->offset == 0) {
      uv__free(queued_fds);
      server->queued_fds = NULL;
    } else {
      /* Shift rest */
      memmove(queued_fds->fds,
              queued_fds->fds + 1,
              queued_fds->offset * sizeof(*queued_fds->fds));
    }
  } else {
    server->accepted_fd = -1;
    if (err == 0)
      uv__io_start(server->loop, &server->io_watcher, POLLIN);
  }
  return err;
}